

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O0

pcp_errno pcp_db_foreach_flow(pcp_ctx_t *ctx,pcp_db_flow_iterate f,void *data)

{
  pcp_flow_s *ppVar1;
  int iVar2;
  uint local_3c;
  uint32_t indx;
  pcp_flow_t *fdb_next;
  pcp_flow_t *fdb;
  void *data_local;
  pcp_db_flow_iterate f_local;
  pcp_ctx_t *ctx_local;
  
  if ((f != (pcp_db_flow_iterate)0x0) && (ctx != (pcp_ctx_t *)0x0)) {
    local_3c = 0;
    do {
      if (0x3f < local_3c) {
        return PCP_ERR_NOT_FOUND;
      }
      fdb_next = (ctx->pcp_db).flows[local_3c];
      while (fdb_next != (pcp_flow_t *)0x0) {
        ppVar1 = fdb_next->next;
        iVar2 = (*f)(fdb_next,data);
        fdb_next = ppVar1;
        if (iVar2 != 0) {
          return PCP_ERR_SUCCESS;
        }
      }
      local_3c = local_3c + 1;
    } while( true );
  }
  __assert_fail("f && ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/lib/src/pcp_client_db.c"
                ,0xd8,"pcp_errno pcp_db_foreach_flow(pcp_ctx_t *, pcp_db_flow_iterate, void *)");
}

Assistant:

pcp_errno pcp_db_foreach_flow(pcp_ctx_t *ctx, pcp_db_flow_iterate f,
                              void *data) {
    pcp_flow_t *fdb, *fdb_next = NULL;
    uint32_t indx;

    assert(f && ctx);

    for (indx = 0; indx < FLOW_HASH_SIZE; ++indx) {
        fdb = ctx->pcp_db.flows[indx];
        while (fdb != NULL) {
            fdb_next = (fdb->next);
            if ((*f)(fdb, data)) {
                return PCP_ERR_SUCCESS;
            }
            fdb = fdb_next;
        }
    }

    return PCP_ERR_NOT_FOUND;
}